

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

void ecs_table_unset(ecs_world_t *world,ecs_table_t *table)

{
  ecs_data_t *data_00;
  ecs_data_t *data;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  data_00 = ecs_table_get_data(table);
  if (data_00 != (ecs_data_t *)0x0) {
    run_un_set_handlers(world,table,data_00);
  }
  return;
}

Assistant:

void ecs_table_unset(
    ecs_world_t * world,
    ecs_table_t * table)
{
    (void)world;
    ecs_data_t *data = ecs_table_get_data(table);
    if (data) {
        run_un_set_handlers(world, table, data);
    }   
}